

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_get.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> __thiscall
duckdb::CreateTableFilterSet
          (duckdb *this,TableFilterSet *table_filters,vector<duckdb::ColumnIndex,_true> *column_ids)

{
  idx_t iVar1;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var3;
  undefined8 *puVar4;
  const_reference pvVar5;
  map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  *this_00;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  InternalException *this_01;
  size_type __n;
  _Rb_tree_header *p_Var8;
  optional_idx column_index;
  optional_idx local_58;
  string local_50;
  
  puVar4 = (undefined8 *)operator_new(0x30);
  puVar4[2] = 0;
  puVar4[3] = 0;
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[3] = puVar4 + 1;
  puVar4[4] = puVar4 + 1;
  puVar4[5] = 0;
  *(undefined8 **)this = puVar4;
  p_Var7 = (table_filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(table_filters->filters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var8) {
    do {
      local_58.index = 0xffffffffffffffff;
      if ((column_ids->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (column_ids->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_start) {
LAB_00f2b531:
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Could not find column index for table filter","");
        InternalException::InternalException(this_01,&local_50);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __n = 0;
      do {
        iVar1 = *(idx_t *)(p_Var7 + 1);
        pvVar5 = vector<duckdb::ColumnIndex,_true>::operator[](column_ids,__n);
        if (iVar1 == pvVar5->index) {
          optional_idx::optional_idx((optional_idx *)&local_50,__n);
          local_58.index = (idx_t)local_50._M_dataplus._M_p;
          break;
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(column_ids->
                                   super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                   ).
                                   super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(column_ids->
                                   super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                   ).
                                   super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
      if ((pointer)local_58.index == (pointer)0xffffffffffffffff) goto LAB_00f2b531;
      this_00 = &unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                 ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                               *)this)->filters;
      local_50._M_dataplus._M_p = (pointer)optional_idx::GetIndex(&local_58);
      pmVar6 = ::std::
               map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
               ::operator[](this_00,(key_type *)&local_50);
      _Var2._M_head_impl = (TableFilter *)p_Var7[1]._M_parent;
      p_Var7[1]._M_parent = (_Base_ptr)0x0;
      _Var3._M_head_impl =
           (pmVar6->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
      (pmVar6->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
      _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
      _M_t.super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
      super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var3._M_head_impl != (TableFilter *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_TableFilter + 8))();
      }
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var8);
  }
  return (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
         (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)this;
}

Assistant:

unique_ptr<TableFilterSet> CreateTableFilterSet(TableFilterSet &table_filters, const vector<ColumnIndex> &column_ids) {
	// create the table filter map
	auto table_filter_set = make_uniq<TableFilterSet>();
	for (auto &table_filter : table_filters.filters) {
		// find the relative column index from the absolute column index into the table
		optional_idx column_index;
		for (idx_t i = 0; i < column_ids.size(); i++) {
			if (table_filter.first == column_ids[i].GetPrimaryIndex()) {
				column_index = i;
				break;
			}
		}
		if (!column_index.IsValid()) {
			throw InternalException("Could not find column index for table filter");
		}
		table_filter_set->filters[column_index.GetIndex()] = std::move(table_filter.second);
	}
	return table_filter_set;
}